

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<int>::AutoFill(TPZMatrix<int> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  ulong in_XMM1_Qb;
  int val;
  int local_54;
  int local_50;
  int local_4c;
  double local_48;
  ulong uStack_40;
  
  local_50 = symmetric;
  (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xd])();
  for (lVar2 = 0; lVar2 < (this->super_TPZBaseMatrix).fRow; lVar2 = lVar2 + 1) {
    if (local_50 == 0) {
      iVar3 = 0;
      lVar5 = 0;
    }
    else {
      iVar3 = 0;
      for (lVar4 = 0; lVar5 = lVar2, lVar2 != lVar4; lVar4 = lVar4 + 1) {
        local_54 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                             (this,lVar4,lVar2);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar2,lVar4,&local_54);
        iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (this,lVar2,lVar4);
        iVar3 = (int)((double)iVar3 + ABS((double)iVar1));
      }
    }
    while( true ) {
      lVar4 = (this->super_TPZBaseMatrix).fCol;
      if (lVar4 <= lVar5) break;
      local_48 = (double)iVar3;
      uStack_40 = in_XMM1_Qb;
      local_4c = rand();
      local_4c = local_4c / 0x7fffffff;
      if (lVar2 != lVar5) {
        iVar3 = (int)(ABS((double)local_4c) + local_48);
      }
      iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                        (this,lVar2,lVar5,&local_4c);
      if (iVar1 == 0) {
        Error("AutoFill (TPZMatrix) failed.",(char *)0x0);
      }
      lVar5 = lVar5 + 1;
    }
    if ((this->super_TPZBaseMatrix).fRow == lVar4) {
      local_48 = ABS((double)iVar3);
      uStack_40 = in_XMM1_Qb & 0x7fffffffffffffff;
      iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                        (this,lVar2,lVar2);
      in_XMM1_Qb = uStack_40;
      if (ABS((double)iVar1) < local_48) {
        local_54 = iVar3 + 1;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar2,lVar2,&local_54);
      }
      if ((iVar3 == 0) &&
         (iVar3 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                            (this,lVar2,lVar2), iVar3 == 0)) {
        local_54 = 1;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar2,lVar2,&local_54);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric) {
    Resize(nrow,ncol);
	int64_t i, j;
	TVar val, sum;
	/** Fill data */
	for(i=0;i<Rows();i++) {
		sum = 0.0;
        j=0;
        if (symmetric) {
            for (; j<i; j++) {
                if constexpr (is_complex<TVar>::value){
                    //hermitian matrices
                    PutVal(i, j, std::conj(GetVal(j,i)));
                }else{
                    PutVal(i, j, GetVal(j,i));
                }
                sum += fabs(GetVal(i, j));
            }
        }
		for(;j<Cols();j++) {
			val = GetRandomVal();
            if constexpr(is_complex<TVar>::value){
                if(j==i) val = fabs(val);
            }
            if(i!=j) sum += fabs(val);
			if(!PutVal(i,j,val))
				Error("AutoFill (TPZMatrix) failed.");
			
		}
		if (Rows() == Cols()) {
		  /** Making diagonally dominant and non zero in diagonal */
		  if(fabs(sum) > fabs(GetVal(i,i)))            // Deve satisfazer:  |Aii| > SUM( |Aij| )  sobre j != i
			  PutVal(i,i,sum+(TVar)1.);
		  // To sure diagonal is not zero.
		  if(IsZero(sum) && IsZero(GetVal(i,i)))
			  PutVal(i,i,1.);
		}
	}
}